

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_migrate.cpp
# Opt level: O3

LOs __thiscall
Omega_h::form_new_conn(Omega_h *this,Dist *new_ents2old_owners,Dist *old_owners2new_uses)

{
  void **ppvVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Dist *other;
  Alloc *pAVar6;
  LO LVar7;
  LO LVar8;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar9;
  long lVar10;
  undefined4 uVar11;
  long lVar12;
  long lVar13;
  LOs LVar14;
  IntIterator last;
  Write<int> serv_uses2new_idxs;
  LOs old_owners2serv_ents;
  LOs old_owners2serv_uses;
  Read<int> serv_uses2ranks;
  Read<int> serv_ents2ranks;
  Read<int> serv_ents2new_idxs;
  Dist serv_uses2new_uses;
  type f;
  Dist old_owners2new_ents;
  Write<int> local_2d0;
  Dist *local_2c0;
  Write<int> local_2b8;
  Alloc *local_2a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2a0;
  Alloc *local_298;
  void *local_290;
  undefined1 local_288 [24];
  void *local_270;
  undefined1 local_268 [16];
  Alloc *local_258;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_250;
  Alloc *local_248;
  void *pvStack_240;
  element_type *local_238;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_230;
  Alloc *local_228;
  void *pvStack_220;
  element_type *local_218;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_210;
  element_type *local_208;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_200;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f0;
  Read<signed_char> local_1e8;
  Read<int> local_1d8;
  undefined1 local_1c8 [32];
  element_type *local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a0;
  Alloc *local_198;
  void *local_190;
  element_type *local_188;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_180;
  element_type *local_178;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_170;
  Alloc *local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_130;
  Alloc *local_128;
  void *local_120;
  element_type *local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  Alloc *local_108;
  void *local_100;
  element_type *local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  element_type *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  LOs local_d8;
  Dist local_c0;
  
  LVar7 = Dist::nitems(new_ents2old_owners);
  local_c0.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_c0.roots2items_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
  Read<int>::Read(&local_1d8,LVar7,0,1,(string *)&local_c0);
  Dist::exch<int>((Dist *)local_268,(Read<int> *)new_ents2old_owners,(Int)&local_1d8);
  if (((ulong)local_1d8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_1d8.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_1d8.write_.shared_alloc_.alloc);
      operator_delete(local_1d8.write_.shared_alloc_.alloc,0x48);
    }
  }
  if (local_c0.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)local_c0.roots2items_) {
    operator_delete(local_c0.parent_comm_.
                    super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (ulong)((long)&(local_c0.roots2items_[0].write_.shared_alloc_.alloc)->size + 1))
    ;
  }
  Dist::invert(&local_c0,new_ents2old_owners);
  Dist::items2ranks((Dist *)(local_288 + 0x10));
  Dist::items2ranks((Dist *)local_288);
  LVar7 = Dist::nitems(old_owners2new_uses);
  Dist::roots2items(old_owners2new_uses);
  Dist::roots2items(&local_c0);
  local_2c0 = old_owners2new_uses;
  LVar8 = Dist::nroots(&local_c0);
  local_1c8._0_8_ = (Alloc *)(local_1c8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"");
  Write<int>::Write(&local_2d0,LVar7,(string *)local_1c8);
  if ((Alloc *)local_1c8._0_8_ != (Alloc *)(local_1c8 + 0x10)) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
  }
  local_138 = local_2a8;
  if (((ulong)local_2a8 & 7) == 0 && local_2a8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_138 = (Alloc *)(local_2a8->size * 8 + 1);
    }
    else {
      local_2a8->use_count = local_2a8->use_count + 1;
    }
  }
  local_130 = local_2a0;
  local_128 = local_298;
  if (((ulong)local_298 & 7) == 0 && local_298 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_128 = (Alloc *)(local_298->size * 8 + 1);
    }
    else {
      local_298->use_count = local_298->use_count + 1;
    }
  }
  local_120 = local_290;
  local_118 = (element_type *)local_288._0_8_;
  if ((local_288._0_8_ & 7) == 0 && (element_type *)local_288._0_8_ != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_118 = (element_type *)((long)*(Library **)local_288._0_8_ * 8 + 1);
    }
    else {
      ppvVar1 = &(((HostRead<int> *)(local_288._0_8_ + 0x28))->read_).write_.shared_alloc_.
                 direct_ptr;
      *(int *)ppvVar1 = *(int *)ppvVar1 + 1;
    }
  }
  local_110 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_;
  local_108 = (Alloc *)local_288._16_8_;
  if ((local_288._16_8_ & 7) == 0 && (Alloc *)local_288._16_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_108 = (Alloc *)(*(size_t *)local_288._16_8_ * 8 + 1);
    }
    else {
      *(int *)(local_288._16_8_ + 0x30) = *(int *)(local_288._16_8_ + 0x30) + 1;
    }
  }
  local_100 = local_270;
  local_f8 = (element_type *)local_268._0_8_;
  if ((local_268._0_8_ & 7) == 0 && (element_type *)local_268._0_8_ != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8 = (element_type *)((long)*(Library **)local_268._0_8_ * 8 + 1);
    }
    else {
      ppvVar1 = &(((HostRead<int> *)(local_268._0_8_ + 0x28))->read_).write_.shared_alloc_.
                 direct_ptr;
      *(int *)ppvVar1 = *(int *)ppvVar1 + 1;
    }
  }
  local_f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_;
  local_e8 = (element_type *)local_2d0.shared_alloc_.alloc;
  if (((ulong)local_2d0.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_2d0.shared_alloc_.alloc != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_e8 = (element_type *)((long)(local_2d0.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      ppvVar1 = &(((HostRead<int> *)&(local_2d0.shared_alloc_.alloc)->ptr)->read_).write_.
                 shared_alloc_.direct_ptr;
      *(int *)ppvVar1 = *(int *)ppvVar1 + 1;
    }
  }
  local_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d0.shared_alloc_.direct_ptr;
  local_258 = local_138;
  if (((ulong)local_138 & 7) == 0 && local_138 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_258 = (Alloc *)(local_138->size * 8 + 1);
    }
    else {
      local_138->use_count = local_138->use_count + 1;
    }
  }
  p_Stack_250 = local_2a0;
  local_248 = local_128;
  if (((ulong)local_128 & 7) == 0 && local_128 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_248 = (Alloc *)(local_128->size * 8 + 1);
    }
    else {
      local_128->use_count = local_128->use_count + 1;
    }
  }
  pvStack_240 = local_290;
  local_238 = local_118;
  if (((ulong)local_118 & 7) == 0 && local_118 != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_238 = (element_type *)((long)local_118->library_ * 8 + 1);
    }
    else {
      ppvVar1 = &(local_118->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar1 = *(int *)ppvVar1 + 1;
    }
  }
  p_Stack_230 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_;
  local_228 = local_108;
  if (((ulong)local_108 & 7) == 0 && local_108 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_228 = (Alloc *)(local_108->size * 8 + 1);
    }
    else {
      local_108->use_count = local_108->use_count + 1;
    }
  }
  pvStack_220 = local_270;
  local_218 = local_f8;
  if (((ulong)local_f8 & 7) == 0 && local_f8 != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_218 = (element_type *)((long)local_f8->library_ * 8 + 1);
    }
    else {
      ppvVar1 = &(local_f8->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar1 = *(int *)ppvVar1 + 1;
    }
  }
  _Stack_210._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_;
  local_208 = local_e8;
  if (((ulong)local_e8 & 7) == 0 && local_e8 != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_208 = (element_type *)((long)local_e8->library_ * 8 + 1);
    }
    else {
      ppvVar1 = &(local_e8->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar1 = *(int *)ppvVar1 + 1;
    }
  }
  _Stack_200._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d0.shared_alloc_.direct_ptr;
  if (0 < LVar8) {
    local_1c8._8_8_ = local_2a0;
    local_1c8._0_8_ = local_258;
    if (((ulong)local_258 & 7) == 0 && local_258 != (Alloc *)0x0) {
      local_258->use_count = local_258->use_count + -1;
      local_1c8._0_8_ = local_258->size * 8 + 1;
    }
    local_258 = (Alloc *)0x0;
    p_Stack_250 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1c8._24_8_ = local_290;
    local_1c8._16_8_ = local_248;
    if (((ulong)local_248 & 7) == 0 && local_248 != (Alloc *)0x0) {
      local_248->use_count = local_248->use_count + -1;
      local_1c8._16_8_ = local_248->size * 8 + 1;
    }
    local_248 = (Alloc *)0x0;
    pvStack_240 = (void *)0x0;
    local_1a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._8_8_;
    local_1a8 = local_238;
    if (((ulong)local_238 & 7) == 0 && local_238 != (element_type *)0x0) {
      ppvVar1 = &(local_238->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar1 = *(int *)ppvVar1 + -1;
      local_1a8 = (element_type *)((long)local_238->library_ * 8 + 1);
    }
    local_238 = (element_type *)0x0;
    p_Stack_230 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_190 = local_270;
    local_198 = local_228;
    if (((ulong)local_228 & 7) == 0 && local_228 != (Alloc *)0x0) {
      local_228->use_count = local_228->use_count + -1;
      local_198 = (Alloc *)(local_228->size * 8 + 1);
    }
    local_228 = (Alloc *)0x0;
    pvStack_220 = (void *)0x0;
    local_180 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_;
    local_188 = local_218;
    if (((ulong)local_218 & 7) == 0 && local_218 != (element_type *)0x0) {
      ppvVar1 = &(local_218->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar1 = *(int *)ppvVar1 + -1;
      local_188 = (element_type *)((long)local_218->library_ * 8 + 1);
    }
    local_218 = (element_type *)0x0;
    _Stack_210._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_170 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d0.shared_alloc_.direct_ptr;
    local_178 = local_208;
    if (((ulong)local_208 & 7) == 0 && local_208 != (element_type *)0x0) {
      ppvVar1 = &(local_208->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar1 = *(int *)ppvVar1 + -1;
      local_178 = (element_type *)((long)local_208->library_ * 8 + 1);
    }
    local_208 = (element_type *)0x0;
    _Stack_200._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    entering_parallel = '\0';
    lVar12 = 0;
    do {
      iVar3 = *(int *)((long)local_290 + lVar12 * 4);
      lVar13 = (long)iVar3;
      iVar4 = *(int *)((long)local_290 + lVar12 * 4 + 4);
      if (iVar3 < iVar4) {
        iVar3 = *(int *)((long)&local_2a0->_vptr__Sp_counted_base + lVar12 * 4 + 4);
        iVar5 = *(int *)((long)&local_2a0->_vptr__Sp_counted_base + lVar12 * 4);
        do {
          uVar11 = 0xffffffff;
          if (iVar5 < iVar3) {
            lVar10 = 0;
            do {
              if (*(int *)((long)local_270 + lVar10 * 4 + (long)iVar5 * 4) ==
                  *(int *)((long)(_func_int ***)local_288._8_8_ + lVar13 * 4)) {
                uVar11 = *(undefined4 *)
                          ((long)(_func_int ***)local_268._8_8_ + lVar10 * 4 + (long)iVar5 * 4);
                break;
              }
              lVar10 = lVar10 + 1;
            } while (iVar3 - iVar5 != (int)lVar10);
          }
          *(undefined4 *)((long)(_func_int ***)local_2d0.shared_alloc_.direct_ptr + lVar13 * 4) =
               uVar11;
          lVar13 = lVar13 + 1;
        } while (lVar13 != iVar4);
      }
      lVar12 = lVar12 + 1;
    } while (LVar8 != (int)lVar12);
    local_1f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
    form_new_conn(Omega_h::Dist,Omega_h::Dist)::$_0::~__0((__0 *)local_1c8);
    this = (Omega_h *)local_1f0._M_pi;
  }
  other = local_2c0;
  form_new_conn(Omega_h::Dist,Omega_h::Dist)::$_0::~__0((__0 *)&local_258);
  Dist::Dist((Dist *)local_1c8,other);
  local_d8.write_.shared_alloc_.alloc = (Alloc *)0x0;
  local_d8.write_.shared_alloc_.direct_ptr = (void *)0x0;
  Dist::set_roots2items((Dist *)local_1c8,&local_d8);
  pAVar6 = local_d8.write_.shared_alloc_.alloc;
  if (((ulong)local_d8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_d8.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_d8.write_.shared_alloc_.alloc);
      operator_delete(pAVar6,0x48);
    }
  }
  local_2b8.shared_alloc_.alloc = local_2d0.shared_alloc_.alloc;
  if (((ulong)local_2d0.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_2d0.shared_alloc_.alloc != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_2b8.shared_alloc_.alloc = (Alloc *)((long)(local_2d0.shared_alloc_.alloc)->size * 8 + 1)
      ;
    }
    else {
      ppvVar1 = &(((HostRead<int> *)&(local_2d0.shared_alloc_.alloc)->ptr)->read_).write_.
                 shared_alloc_.direct_ptr;
      *(int *)ppvVar1 = *(int *)ppvVar1 + 1;
    }
  }
  local_2b8.shared_alloc_.direct_ptr = local_2d0.shared_alloc_.direct_ptr;
  Read<int>::Read(&local_1e8,&local_2b8);
  Dist::exch<int>((Dist *)this,(Read<int> *)local_1c8,(Int)&local_1e8);
  if (((ulong)local_1e8.write_.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_1e8.write_.shared_alloc_.alloc != (element_type *)0x0) {
    ppvVar1 = &(((HostRead<int> *)&(local_1e8.write_.shared_alloc_.alloc)->ptr)->read_).write_.
               shared_alloc_.direct_ptr;
    *(int *)ppvVar1 = *(int *)ppvVar1 + -1;
    if (*(int *)ppvVar1 == 0) {
      Alloc::~Alloc(local_1e8.write_.shared_alloc_.alloc);
      operator_delete(local_1e8.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar6 = local_2b8.shared_alloc_.alloc;
  if (((ulong)local_2b8.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_2b8.shared_alloc_.alloc != (element_type *)0x0) {
    ppvVar1 = &(((HostRead<int> *)&(local_2b8.shared_alloc_.alloc)->ptr)->read_).write_.
               shared_alloc_.direct_ptr;
    *(int *)ppvVar1 = *(int *)ppvVar1 + -1;
    if (*(int *)ppvVar1 == 0) {
      Alloc::~Alloc(local_2b8.shared_alloc_.alloc);
      operator_delete(pAVar6,0x48);
    }
  }
  Dist::~Dist((Dist *)local_1c8);
  form_new_conn(Omega_h::Dist,Omega_h::Dist)::$_0::~__0((__0 *)&local_138);
  if (((ulong)local_2d0.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_2d0.shared_alloc_.alloc != (element_type *)0x0) {
    ppvVar1 = &(((HostRead<int> *)&(local_2d0.shared_alloc_.alloc)->ptr)->read_).write_.
               shared_alloc_.direct_ptr;
    *(int *)ppvVar1 = *(int *)ppvVar1 + -1;
    if (*(int *)ppvVar1 == 0) {
      Alloc::~Alloc(local_2d0.shared_alloc_.alloc);
      operator_delete(local_2d0.shared_alloc_.alloc,0x48);
    }
  }
  if (((ulong)local_2a8 & 7) == 0 && local_2a8 != (Alloc *)0x0) {
    piVar2 = &local_2a8->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_2a8);
      operator_delete(local_2a8,0x48);
    }
  }
  if (((ulong)local_298 & 7) == 0 && local_298 != (Alloc *)0x0) {
    piVar2 = &local_298->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_298);
      operator_delete(local_298,0x48);
    }
  }
  if ((local_288._0_8_ & 7) == 0 && (element_type *)local_288._0_8_ != (element_type *)0x0) {
    ppvVar1 = &(((HostRead<int> *)(local_288._0_8_ + 0x28))->read_).write_.shared_alloc_.direct_ptr;
    *(int *)ppvVar1 = *(int *)ppvVar1 + -1;
    if (*(int *)ppvVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_288._0_8_);
      operator_delete((void *)local_288._0_8_,0x48);
    }
  }
  if ((local_288._16_8_ & 7) == 0 && (Alloc *)local_288._16_8_ != (Alloc *)0x0) {
    piVar2 = (int *)(local_288._16_8_ + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc((Alloc *)local_288._16_8_);
      operator_delete((void *)local_288._16_8_,0x48);
    }
  }
  Dist::~Dist(&local_c0);
  pvVar9 = extraout_RDX;
  if ((local_268._0_8_ & 7) == 0 && (element_type *)local_268._0_8_ != (element_type *)0x0) {
    ppvVar1 = &(((HostRead<int> *)(local_268._0_8_ + 0x28))->read_).write_.shared_alloc_.direct_ptr;
    *(int *)ppvVar1 = *(int *)ppvVar1 + -1;
    if (*(int *)ppvVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_268._0_8_);
      operator_delete((void *)local_268._0_8_,0x48);
      pvVar9 = extraout_RDX_00;
    }
  }
  LVar14.write_.shared_alloc_.direct_ptr = pvVar9;
  LVar14.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar14.write_.shared_alloc_;
}

Assistant:

LOs form_new_conn(Dist new_ents2old_owners, Dist old_owners2new_uses) {
  auto nnew_ents = new_ents2old_owners.nitems();
  auto serv_ents2new_idxs = new_ents2old_owners.exch(LOs(nnew_ents, 0, 1), 1);
  auto old_owners2new_ents = new_ents2old_owners.invert();
  auto serv_ents2ranks = old_owners2new_ents.items2ranks();
  auto serv_uses2ranks = old_owners2new_uses.items2ranks();
  auto nserv_uses = old_owners2new_uses.nitems();
  auto old_owners2serv_uses = old_owners2new_uses.roots2items();
  auto old_owners2serv_ents = old_owners2new_ents.roots2items();
  auto nold_owners = old_owners2new_ents.nroots();
  Write<LO> serv_uses2new_idxs(nserv_uses);
  auto f = OMEGA_H_LAMBDA(LO old_owner) {
    auto ebegin = old_owners2serv_ents[old_owner];
    auto eend = old_owners2serv_ents[old_owner + 1];
    auto ubegin = old_owners2serv_uses[old_owner];
    auto uend = old_owners2serv_uses[old_owner + 1];
    for (auto serv_use = ubegin; serv_use < uend; ++serv_use) {
      auto rank = serv_uses2ranks[serv_use];
      LO idx = -1;
      for (auto e = ebegin; e < eend; ++e) {
        if (serv_ents2ranks[e] == rank) {
          idx = serv_ents2new_idxs[e];
          break;
        }
      }
      serv_uses2new_idxs[serv_use] = idx;
    }
  };
  parallel_for(nold_owners, f, "form_new_conn");
  auto serv_uses2new_uses = old_owners2new_uses;
  serv_uses2new_uses.set_roots2items(LOs());
  return serv_uses2new_uses.exch(LOs(serv_uses2new_idxs), 1);
}